

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::
VisitSerialArena<google::protobuf::internal::ThreadSafeArena::UnpoisonAllArenaBlocks()const::__0>
          (ThreadSafeArena *this)

{
  ThreadSafeArena *this_local;
  
  UnpoisonAllArenaBlocks::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&this_local + 7),&this->first_arena_);
  WalkConstSerialArenaChunk<google::protobuf::internal::ThreadSafeArena::VisitSerialArena<google::protobuf::internal::ThreadSafeArena::UnpoisonAllArenaBlocks()const::__0>(google::protobuf::internal::ThreadSafeArena::UnpoisonAllArenaBlocks()const::__0)const::_lambda(google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_const*)_1_>
            (this,(anon_class_1_0_00000001 *)((long)&this_local + 7));
  return;
}

Assistant:

void ThreadSafeArena::VisitSerialArena(Callback fn) const {
  // In most cases, arenas are single-threaded and "first_arena_" should be
  // sufficient.
  fn(&first_arena_);

  WalkConstSerialArenaChunk([&fn](const SerialArenaChunk* chunk) {
    for (const auto& each : chunk->arenas()) {
      const SerialArena* serial = each.load(std::memory_order_acquire);
      // It is possible that newly added SerialArena is not updated although
      // size was. This is acceptable for SpaceAllocated and SpaceUsed.
      if (serial == nullptr) continue;
      fn(serial);
    }
  });
}